

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_16781328,_true,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  bool bVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [32];
  char cVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  NodeRef *pNVar17;
  ulong uVar18;
  ulong uVar19;
  ulong unaff_R15;
  byte bVar20;
  ulong uVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  vfloat4 a0;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar86 [64];
  Precalculations pre;
  NodeRef stack [564];
  int iVar22;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      aVar3 = (ray->dir).field_0.field_1;
      auVar25 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
      auVar9 = ZEXT812(0) << 0x20;
      auVar28 = ZEXT816(0) << 0x40;
      auVar67._4_12_ = auVar9;
      auVar67._0_4_ = auVar25._0_4_;
      auVar23 = vrsqrt14ss_avx512f(auVar28,auVar67);
      fVar66 = auVar23._0_4_;
      uVar1 = *(undefined4 *)&(ray->dir).field_0;
      pre.depth_scale = fVar66 * 1.5 - auVar25._0_4_ * 0.5 * fVar66 * fVar66 * fVar66;
      uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar66 = (ray->dir).field_0.m128[2];
      auVar68._0_4_ = aVar3.x * pre.depth_scale;
      auVar68._4_4_ = aVar3.y * pre.depth_scale;
      auVar68._8_4_ = aVar3.z * pre.depth_scale;
      auVar68._12_4_ = aVar3.field_3.w * pre.depth_scale;
      auVar23 = vshufpd_avx(auVar68,auVar68,1);
      auVar25 = vmovshdup_avx(auVar68);
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar74._0_4_ = auVar25._0_4_ ^ 0x80000000;
      auVar25 = vunpckhps_avx(auVar68,auVar28);
      auVar74._4_12_ = auVar9;
      auVar27 = vshufps_avx(auVar25,auVar74,0x41);
      auVar71._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      auVar71._8_8_ = auVar78._8_8_ ^ auVar23._8_8_;
      auVar24 = vinsertps_avx(auVar71,auVar68,0x2a);
      auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
      auVar23 = vdpps_avx(auVar24,auVar24,0x7f);
      uVar6 = vcmpps_avx512vl(auVar23,auVar25,1);
      auVar25 = vpmovm2d_avx512vl(uVar6);
      auVar79._0_4_ = auVar25._0_4_;
      auVar79._4_4_ = auVar79._0_4_;
      auVar79._8_4_ = auVar79._0_4_;
      auVar79._12_4_ = auVar79._0_4_;
      uVar21 = vpmovd2m_avx512vl(auVar79);
      auVar25 = vpcmpeqd_avx(auVar79,auVar79);
      auVar23._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar25._4_4_;
      auVar23._0_4_ = (uint)((byte)uVar21 & 1) * auVar25._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar25._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar25._12_4_;
      auVar25 = vblendvps_avx(auVar24,auVar27,auVar23);
      auVar23 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar80._4_12_ = auVar9;
      auVar80._0_4_ = auVar23._0_4_;
      auVar24 = vrsqrt14ss_avx512f(auVar28,auVar80);
      fVar77 = auVar24._0_4_;
      fVar77 = fVar77 * 1.5 - auVar23._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
      auVar72._0_4_ = fVar77 * auVar25._0_4_;
      auVar72._4_4_ = fVar77 * auVar25._4_4_;
      auVar72._8_4_ = fVar77 * auVar25._8_4_;
      auVar72._12_4_ = fVar77 * auVar25._12_4_;
      auVar25 = vshufps_avx(auVar72,auVar72,0xc9);
      auVar23 = vshufps_avx(auVar68,auVar68,0xc9);
      auVar81._0_4_ = auVar23._0_4_ * auVar72._0_4_;
      auVar81._4_4_ = auVar23._4_4_ * auVar72._4_4_;
      auVar81._8_4_ = auVar23._8_4_ * auVar72._8_4_;
      auVar81._12_4_ = auVar23._12_4_ * auVar72._12_4_;
      auVar25 = vfmsub231ps_fma(auVar81,auVar68,auVar25);
      auVar23 = vshufps_avx(auVar25,auVar25,0xc9);
      auVar75 = ZEXT1664(auVar23);
      auVar25 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar82._4_12_ = auVar9;
      auVar82._0_4_ = auVar25._0_4_;
      auVar24 = vrsqrt14ss_avx512f(auVar28,auVar82);
      fVar77 = auVar24._0_4_;
      fVar77 = fVar77 * 1.5 - auVar25._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
      auVar69._0_4_ = auVar23._0_4_ * fVar77;
      auVar69._4_4_ = auVar23._4_4_ * fVar77;
      auVar69._8_4_ = auVar23._8_4_ * fVar77;
      auVar69._12_4_ = auVar23._12_4_ * fVar77;
      auVar64._0_4_ = pre.depth_scale * auVar68._0_4_;
      auVar64._4_4_ = pre.depth_scale * auVar68._4_4_;
      auVar64._8_4_ = pre.depth_scale * auVar68._8_4_;
      auVar64._12_4_ = pre.depth_scale * auVar68._12_4_;
      auVar24 = vunpcklps_avx(auVar72,auVar64);
      auVar25 = vunpckhps_avx(auVar72,auVar64);
      auVar27 = vunpcklps_avx(auVar69,auVar28);
      auVar23 = vunpckhps_avx(auVar69,auVar28);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar25,auVar23);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar24,auVar27);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar24,auVar27);
      pNVar17 = stack + 1;
      auVar23 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx512vl((undefined1  [16])aVar3,auVar25);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar21 = vcmpps_avx512vl(auVar25,auVar24,1);
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = &DAT_3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar25 = vdivps_avx(auVar65,(undefined1  [16])aVar3);
      auVar24 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar4 = (bool)((byte)uVar21 & 1);
      auVar26._0_4_ = (uint)bVar4 * auVar24._0_4_ | (uint)!bVar4 * auVar25._0_4_;
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar4 * auVar24._4_4_ | (uint)!bVar4 * auVar25._4_4_;
      bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar4 * auVar24._8_4_ | (uint)!bVar4 * auVar25._8_4_;
      bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar4 * auVar24._12_4_ | (uint)!bVar4 * auVar25._12_4_;
      auVar27._8_4_ = 0x3f7ffffa;
      auVar27._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar27._12_4_ = 0x3f7ffffa;
      auVar27 = vmulps_avx512vl(auVar26,auVar27);
      auVar28._8_4_ = 0x3f800003;
      auVar28._0_8_ = 0x3f8000033f800003;
      auVar28._12_4_ = 0x3f800003;
      auVar28 = vmulps_avx512vl(auVar26,auVar28);
      auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar32 = vbroadcastss_avx512vl(auVar27);
      auVar25 = vmovshdup_avx(auVar27);
      auVar33 = vbroadcastsd_avx512vl(auVar25);
      auVar24 = vshufpd_avx(auVar27,auVar27,1);
      auVar37._8_4_ = 2;
      auVar37._0_8_ = 0x200000002;
      auVar37._12_4_ = 2;
      auVar37._16_4_ = 2;
      auVar37._20_4_ = 2;
      auVar37._24_4_ = 2;
      auVar37._28_4_ = 2;
      auVar34 = vpermps_avx512vl(auVar37,ZEXT1632(auVar27));
      auVar36._8_4_ = 1;
      auVar36._0_8_ = 0x100000001;
      auVar36._12_4_ = 1;
      auVar36._16_4_ = 1;
      auVar36._20_4_ = 1;
      auVar36._24_4_ = 1;
      auVar36._28_4_ = 1;
      auVar35 = vbroadcastss_avx512vl(auVar28);
      auVar36 = vpermps_avx512vl(auVar36,ZEXT1632(auVar28));
      auVar37 = vpermps_avx512vl(auVar37,ZEXT1632(auVar28));
      uVar21 = (ulong)(auVar27._0_4_ < 0.0) * 0x20;
      uVar18 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x40;
      uVar19 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x80;
      auVar38 = vbroadcastss_avx512vl(auVar23);
      auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      do {
        if (pNVar17 == stack) {
          return;
        }
        uVar14 = pNVar17[-1].ptr;
        pNVar17 = pNVar17 + -1;
        do {
          if ((uVar14 & 8) == 0) {
            fVar77 = (ray->dir).field_0.m128[3];
            uVar15 = (uint)uVar14 & 7;
            uVar12 = uVar14 & 0xfffffffffffffff0;
            if (uVar15 == 3) {
              auVar40 = *(undefined1 (*) [32])(uVar12 + 0x100);
              auVar41 = *(undefined1 (*) [32])(uVar12 + 0x120);
              auVar42 = *(undefined1 (*) [32])(uVar12 + 0x140);
              fVar5 = 1.0 - fVar77;
              auVar76._0_4_ = fVar77 * *(float *)(uVar12 + 0x1c0);
              auVar76._4_4_ = fVar77 * *(float *)(uVar12 + 0x1c4);
              auVar76._8_4_ = fVar77 * *(float *)(uVar12 + 0x1c8);
              auVar76._12_4_ = fVar77 * *(float *)(uVar12 + 0x1cc);
              auVar76._16_4_ = fVar77 * *(float *)(uVar12 + 0x1d0);
              auVar76._20_4_ = fVar77 * *(float *)(uVar12 + 0x1d4);
              auVar76._28_36_ = auVar75._28_36_;
              auVar76._24_4_ = fVar77 * *(float *)(uVar12 + 0x1d8);
              auVar83._4_4_ = fVar5;
              auVar83._0_4_ = fVar5;
              auVar83._8_4_ = fVar5;
              auVar83._12_4_ = fVar5;
              auVar83._16_4_ = fVar5;
              auVar83._20_4_ = fVar5;
              auVar83._24_4_ = fVar5;
              auVar83._28_4_ = fVar5;
              auVar73._0_4_ = fVar77 * *(float *)(uVar12 + 0x1e0);
              auVar73._4_4_ = fVar77 * *(float *)(uVar12 + 0x1e4);
              auVar73._8_4_ = fVar77 * *(float *)(uVar12 + 0x1e8);
              auVar73._12_4_ = fVar77 * *(float *)(uVar12 + 0x1ec);
              auVar73._16_4_ = fVar77 * *(float *)(uVar12 + 0x1f0);
              auVar73._20_4_ = fVar77 * *(float *)(uVar12 + 500);
              auVar73._24_4_ = fVar77 * *(float *)(uVar12 + 0x1f8);
              auVar73._28_4_ = 0;
              auVar70._0_4_ = fVar77 * *(float *)(uVar12 + 0x200);
              auVar70._4_4_ = fVar77 * *(float *)(uVar12 + 0x204);
              auVar70._8_4_ = fVar77 * *(float *)(uVar12 + 0x208);
              auVar70._12_4_ = fVar77 * *(float *)(uVar12 + 0x20c);
              auVar70._16_4_ = fVar77 * *(float *)(uVar12 + 0x210);
              auVar70._20_4_ = fVar77 * *(float *)(uVar12 + 0x214);
              auVar70._24_4_ = fVar77 * *(float *)(uVar12 + 0x218);
              auVar70._28_4_ = 0;
              auVar24 = ZEXT816(0) << 0x40;
              auVar25 = vfmadd231ps_fma(auVar76._0_32_,auVar83,ZEXT1632(auVar24));
              auVar75 = ZEXT1664(auVar25);
              auVar23 = vfmadd231ps_fma(auVar73,auVar83,ZEXT1632(auVar24));
              auVar24 = vfmadd231ps_fma(auVar70,auVar83,ZEXT1632(auVar24));
              auVar84._0_4_ = fVar77 * *(float *)(uVar12 + 0x220);
              auVar84._4_4_ = fVar77 * *(float *)(uVar12 + 0x224);
              auVar84._8_4_ = fVar77 * *(float *)(uVar12 + 0x228);
              auVar84._12_4_ = fVar77 * *(float *)(uVar12 + 0x22c);
              auVar84._16_4_ = fVar77 * *(float *)(uVar12 + 0x230);
              auVar84._20_4_ = fVar77 * *(float *)(uVar12 + 0x234);
              auVar84._24_4_ = fVar77 * *(float *)(uVar12 + 0x238);
              auVar84._28_4_ = 0;
              auVar86._0_4_ = fVar77 * *(float *)(uVar12 + 0x240);
              auVar86._4_4_ = fVar77 * *(float *)(uVar12 + 0x244);
              auVar86._8_4_ = fVar77 * *(float *)(uVar12 + 0x248);
              auVar86._12_4_ = fVar77 * *(float *)(uVar12 + 0x24c);
              auVar86._16_4_ = fVar77 * *(float *)(uVar12 + 0x250);
              auVar86._20_4_ = fVar77 * *(float *)(uVar12 + 0x254);
              auVar86._28_36_ = in_ZMM15._28_36_;
              auVar86._24_4_ = fVar77 * *(float *)(uVar12 + 600);
              auVar44 = vaddps_avx512vl(auVar83,auVar84);
              auVar45 = vaddps_avx512vl(auVar83,auVar86._0_32_);
              auVar85._0_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x260);
              auVar85._4_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x264);
              auVar85._8_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x268);
              auVar85._12_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x26c);
              auVar85._16_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x270);
              auVar85._20_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x274);
              auVar85._24_4_ = fVar5 + fVar77 * *(float *)(uVar12 + 0x278);
              auVar85._28_4_ = fVar5 + fVar77;
              in_ZMM15 = ZEXT3264(auVar85);
              auVar43._4_4_ = fVar66 * auVar40._4_4_;
              auVar43._0_4_ = fVar66 * auVar40._0_4_;
              auVar43._8_4_ = fVar66 * auVar40._8_4_;
              auVar43._12_4_ = fVar66 * auVar40._12_4_;
              auVar43._16_4_ = fVar66 * auVar40._16_4_;
              auVar43._20_4_ = fVar66 * auVar40._20_4_;
              auVar43._24_4_ = fVar66 * auVar40._24_4_;
              auVar43._28_4_ = 0;
              auVar46._4_4_ = fVar66 * auVar41._4_4_;
              auVar46._0_4_ = fVar66 * auVar41._0_4_;
              auVar46._8_4_ = fVar66 * auVar41._8_4_;
              auVar46._12_4_ = fVar66 * auVar41._12_4_;
              auVar46._16_4_ = fVar66 * auVar41._16_4_;
              auVar46._20_4_ = fVar66 * auVar41._20_4_;
              auVar46._24_4_ = fVar66 * auVar41._24_4_;
              auVar46._28_4_ = fVar77;
              auVar47._4_4_ = fVar66 * auVar42._4_4_;
              auVar47._0_4_ = fVar66 * auVar42._0_4_;
              auVar47._8_4_ = fVar66 * auVar42._8_4_;
              auVar47._12_4_ = fVar66 * auVar42._12_4_;
              auVar47._16_4_ = fVar66 * auVar42._16_4_;
              auVar47._20_4_ = fVar66 * auVar42._20_4_;
              auVar47._24_4_ = fVar66 * auVar42._24_4_;
              auVar47._28_4_ = fVar66;
              auVar55._4_4_ = uVar2;
              auVar55._0_4_ = uVar2;
              auVar55._8_4_ = uVar2;
              auVar55._12_4_ = uVar2;
              auVar55._16_4_ = uVar2;
              auVar55._20_4_ = uVar2;
              auVar55._24_4_ = uVar2;
              auVar55._28_4_ = uVar2;
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar55,*(undefined1 (*) [32])(uVar12 + 0xa0));
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar55,*(undefined1 (*) [32])(uVar12 + 0xc0));
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar55,*(undefined1 (*) [32])(uVar12 + 0xe0));
              auVar10._4_4_ = uVar1;
              auVar10._0_4_ = uVar1;
              auVar10._8_4_ = uVar1;
              auVar10._12_4_ = uVar1;
              auVar10._16_4_ = uVar1;
              auVar10._20_4_ = uVar1;
              auVar10._24_4_ = uVar1;
              auVar10._28_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar10,*(undefined1 (*) [32])(uVar12 + 0x40));
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar10,*(undefined1 (*) [32])(uVar12 + 0x60));
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar10,*(undefined1 (*) [32])(uVar12 + 0x80));
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar43,auVar48);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar13 = vcmpps_avx512vl(auVar48,auVar49,1);
              bVar4 = (bool)((byte)uVar13 & 1);
              iVar22 = auVar49._0_4_;
              auVar50._0_4_ = (uint)bVar4 * iVar22 | (uint)!bVar4 * auVar43._0_4_;
              bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
              iVar56 = auVar49._4_4_;
              auVar50._4_4_ = (uint)bVar4 * iVar56 | (uint)!bVar4 * auVar43._4_4_;
              bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
              iVar57 = auVar49._8_4_;
              auVar50._8_4_ = (uint)bVar4 * iVar57 | (uint)!bVar4 * auVar43._8_4_;
              bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
              iVar58 = auVar49._12_4_;
              auVar50._12_4_ = (uint)bVar4 * iVar58 | (uint)!bVar4 * auVar43._12_4_;
              bVar4 = (bool)((byte)(uVar13 >> 4) & 1);
              iVar59 = auVar49._16_4_;
              auVar50._16_4_ = (uint)bVar4 * iVar59 | (uint)!bVar4 * auVar43._16_4_;
              bVar4 = (bool)((byte)(uVar13 >> 5) & 1);
              iVar60 = auVar49._20_4_;
              auVar50._20_4_ = (uint)bVar4 * iVar60 | (uint)!bVar4 * auVar43._20_4_;
              bVar4 = (bool)((byte)(uVar13 >> 6) & 1);
              iVar61 = auVar49._24_4_;
              iVar62 = auVar49._28_4_;
              auVar50._24_4_ = (uint)bVar4 * iVar61 | (uint)!bVar4 * auVar43._24_4_;
              bVar4 = SUB81(uVar13 >> 7,0);
              auVar50._28_4_ = (uint)bVar4 * iVar62 | (uint)!bVar4 * auVar43._28_4_;
              vandps_avx512vl(auVar46,auVar48);
              uVar13 = vcmpps_avx512vl(auVar50,auVar49,1);
              bVar4 = (bool)((byte)uVar13 & 1);
              auVar51._0_4_ = (uint)bVar4 * iVar22 | (uint)!bVar4 * auVar46._0_4_;
              bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar51._4_4_ = (uint)bVar4 * iVar56 | (uint)!bVar4 * auVar46._4_4_;
              bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar51._8_4_ = (uint)bVar4 * iVar57 | (uint)!bVar4 * auVar46._8_4_;
              bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar51._12_4_ = (uint)bVar4 * iVar58 | (uint)!bVar4 * auVar46._12_4_;
              bVar4 = (bool)((byte)(uVar13 >> 4) & 1);
              auVar51._16_4_ = (uint)bVar4 * iVar59 | (uint)!bVar4 * auVar46._16_4_;
              bVar4 = (bool)((byte)(uVar13 >> 5) & 1);
              auVar51._20_4_ = (uint)bVar4 * iVar60 | (uint)!bVar4 * auVar46._20_4_;
              bVar4 = (bool)((byte)(uVar13 >> 6) & 1);
              auVar51._24_4_ = (uint)bVar4 * iVar61 | (uint)!bVar4 * auVar46._24_4_;
              bVar4 = SUB81(uVar13 >> 7,0);
              auVar51._28_4_ = (uint)bVar4 * iVar62 | (uint)!bVar4 * auVar46._28_4_;
              vandps_avx512vl(auVar47,auVar48);
              uVar13 = vcmpps_avx512vl(auVar51,auVar49,1);
              bVar4 = (bool)((byte)uVar13 & 1);
              auVar52._0_4_ = (uint)bVar4 * iVar22 | (uint)!bVar4 * auVar47._0_4_;
              bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar52._4_4_ = (uint)bVar4 * iVar56 | (uint)!bVar4 * auVar47._4_4_;
              bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar52._8_4_ = (uint)bVar4 * iVar57 | (uint)!bVar4 * auVar47._8_4_;
              bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar52._12_4_ = (uint)bVar4 * iVar58 | (uint)!bVar4 * auVar47._12_4_;
              bVar4 = (bool)((byte)(uVar13 >> 4) & 1);
              auVar52._16_4_ = (uint)bVar4 * iVar59 | (uint)!bVar4 * auVar47._16_4_;
              bVar4 = (bool)((byte)(uVar13 >> 5) & 1);
              auVar52._20_4_ = (uint)bVar4 * iVar60 | (uint)!bVar4 * auVar47._20_4_;
              bVar4 = (bool)((byte)(uVar13 >> 6) & 1);
              auVar52._24_4_ = (uint)bVar4 * iVar61 | (uint)!bVar4 * auVar47._24_4_;
              bVar4 = SUB81(uVar13 >> 7,0);
              auVar52._28_4_ = (uint)bVar4 * iVar62 | (uint)!bVar4 * auVar47._28_4_;
              auVar43 = vrcp14ps_avx512vl(auVar50);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar47 = vfnmadd213ps_avx512vl(auVar50,auVar43,auVar46);
              auVar47 = vfmadd132ps_avx512vl(auVar47,auVar43,auVar43);
              auVar43 = vrcp14ps_avx512vl(auVar51);
              auVar48 = vfnmadd213ps_avx512vl(auVar51,auVar43,auVar46);
              auVar53 = vfmadd132ps_avx512vl(auVar48,auVar43,auVar43);
              auVar43 = vrcp14ps_avx512vl(auVar52);
              auVar46 = vfnmadd213ps_avx512vl(auVar52,auVar43,auVar46);
              auVar46 = vfmadd132ps_avx512vl(auVar46,auVar43,auVar43);
              auVar40 = vfmadd213ps_avx512vl(auVar40,auVar31,*(undefined1 (*) [32])(uVar12 + 0x160))
              ;
              auVar41 = vfmadd213ps_avx512vl(auVar41,auVar31,*(undefined1 (*) [32])(uVar12 + 0x180))
              ;
              auVar40 = vfmadd231ps_avx512vl(auVar40,auVar30,*(undefined1 (*) [32])(uVar12 + 0xa0));
              auVar41 = vfmadd231ps_avx512vl(auVar41,auVar30,*(undefined1 (*) [32])(uVar12 + 0xc0));
              auVar42 = vfmadd213ps_avx512vl(auVar42,auVar31,*(undefined1 (*) [32])(uVar12 + 0x1a0))
              ;
              auVar42 = vfmadd231ps_avx512vl(auVar42,auVar30,*(undefined1 (*) [32])(uVar12 + 0xe0));
              auVar43 = vfmadd231ps_avx512vl(auVar40,auVar29,*(undefined1 (*) [32])(uVar12 + 0x40));
              auVar48 = vfmadd231ps_avx512vl(auVar41,auVar29,*(undefined1 (*) [32])(uVar12 + 0x60));
              auVar49 = vfmadd231ps_avx512vl(auVar42,auVar29,*(undefined1 (*) [32])(uVar12 + 0x80));
              auVar40 = vsubps_avx(ZEXT1632(auVar25),auVar43);
              auVar54 = vsubps_avx512vl(auVar44,auVar43);
              auVar41 = vsubps_avx(ZEXT1632(auVar23),auVar48);
              auVar55 = vsubps_avx512vl(auVar45,auVar48);
              auVar42 = vsubps_avx(ZEXT1632(auVar24),auVar49);
              auVar43 = vsubps_avx(auVar85,auVar49);
              auVar44._4_4_ = auVar47._4_4_ * auVar40._4_4_;
              auVar44._0_4_ = auVar47._0_4_ * auVar40._0_4_;
              auVar44._8_4_ = auVar47._8_4_ * auVar40._8_4_;
              auVar44._12_4_ = auVar47._12_4_ * auVar40._12_4_;
              auVar44._16_4_ = auVar47._16_4_ * auVar40._16_4_;
              auVar44._20_4_ = auVar47._20_4_ * auVar40._20_4_;
              auVar44._24_4_ = auVar47._24_4_ * auVar40._24_4_;
              auVar44._28_4_ = auVar40._28_4_;
              auVar45._4_4_ = auVar47._4_4_ * auVar54._4_4_;
              auVar45._0_4_ = auVar47._0_4_ * auVar54._0_4_;
              auVar45._8_4_ = auVar47._8_4_ * auVar54._8_4_;
              auVar45._12_4_ = auVar47._12_4_ * auVar54._12_4_;
              auVar45._16_4_ = auVar47._16_4_ * auVar54._16_4_;
              auVar45._20_4_ = auVar47._20_4_ * auVar54._20_4_;
              auVar45._24_4_ = auVar47._24_4_ * auVar54._24_4_;
              auVar45._28_4_ = auVar54._28_4_;
              auVar48._4_4_ = auVar53._4_4_ * auVar41._4_4_;
              auVar48._0_4_ = auVar53._0_4_ * auVar41._0_4_;
              auVar48._8_4_ = auVar53._8_4_ * auVar41._8_4_;
              auVar48._12_4_ = auVar53._12_4_ * auVar41._12_4_;
              auVar48._16_4_ = auVar53._16_4_ * auVar41._16_4_;
              auVar48._20_4_ = auVar53._20_4_ * auVar41._20_4_;
              auVar48._24_4_ = auVar53._24_4_ * auVar41._24_4_;
              auVar48._28_4_ = auVar41._28_4_;
              auVar49._4_4_ = auVar46._4_4_ * auVar42._4_4_;
              auVar49._0_4_ = auVar46._0_4_ * auVar42._0_4_;
              auVar49._8_4_ = auVar46._8_4_ * auVar42._8_4_;
              auVar49._12_4_ = auVar46._12_4_ * auVar42._12_4_;
              auVar49._16_4_ = auVar46._16_4_ * auVar42._16_4_;
              auVar49._20_4_ = auVar46._20_4_ * auVar42._20_4_;
              auVar49._24_4_ = auVar46._24_4_ * auVar42._24_4_;
              auVar49._28_4_ = auVar42._28_4_;
              auVar54._4_4_ = auVar53._4_4_ * auVar55._4_4_;
              auVar54._0_4_ = auVar53._0_4_ * auVar55._0_4_;
              auVar54._8_4_ = auVar53._8_4_ * auVar55._8_4_;
              auVar54._12_4_ = auVar53._12_4_ * auVar55._12_4_;
              auVar54._16_4_ = auVar53._16_4_ * auVar55._16_4_;
              auVar54._20_4_ = auVar53._20_4_ * auVar55._20_4_;
              auVar54._24_4_ = auVar53._24_4_ * auVar55._24_4_;
              auVar54._28_4_ = auVar55._28_4_;
              auVar53._4_4_ = auVar46._4_4_ * auVar43._4_4_;
              auVar53._0_4_ = auVar46._0_4_ * auVar43._0_4_;
              auVar53._8_4_ = auVar46._8_4_ * auVar43._8_4_;
              auVar53._12_4_ = auVar46._12_4_ * auVar43._12_4_;
              auVar53._16_4_ = auVar46._16_4_ * auVar43._16_4_;
              auVar53._20_4_ = auVar46._20_4_ * auVar43._20_4_;
              auVar53._24_4_ = auVar46._24_4_ * auVar43._24_4_;
              auVar53._28_4_ = auVar43._28_4_;
              auVar40 = vpminsd_avx2(auVar48,auVar54);
              auVar41 = vpminsd_avx2(auVar49,auVar53);
              auVar40 = vmaxps_avx(auVar40,auVar41);
              auVar46 = vpminsd_avx2(auVar44,auVar45);
              auVar42 = vpmaxsd_avx2(auVar44,auVar45);
              auVar41 = vpmaxsd_avx2(auVar48,auVar54);
              auVar43 = vpmaxsd_avx2(auVar49,auVar53);
              auVar41 = vminps_avx(auVar41,auVar43);
              auVar43 = vmaxps_avx512vl(auVar38,auVar46);
              auVar40 = vmaxps_avx(auVar43,auVar40);
              auVar42 = vminps_avx512vl(auVar39,auVar42);
              auVar41 = vminps_avx(auVar42,auVar41);
              auVar42._8_4_ = 0x3f7ffffa;
              auVar42._0_8_ = 0x3f7ffffa3f7ffffa;
              auVar42._12_4_ = 0x3f7ffffa;
              auVar42._16_4_ = 0x3f7ffffa;
              auVar42._20_4_ = 0x3f7ffffa;
              auVar42._24_4_ = 0x3f7ffffa;
              auVar42._28_4_ = 0x3f7ffffa;
              auVar42 = vmulps_avx512vl(auVar40,auVar42);
              auVar40._8_4_ = 0x3f800003;
              auVar40._0_8_ = 0x3f8000033f800003;
              auVar40._12_4_ = 0x3f800003;
              auVar40._16_4_ = 0x3f800003;
              auVar40._20_4_ = 0x3f800003;
              auVar40._24_4_ = 0x3f800003;
              auVar40._28_4_ = 0x3f800003;
              auVar40 = vmulps_avx512vl(auVar41,auVar40);
              uVar6 = vcmpps_avx512vl(auVar42,auVar40,2);
              bVar20 = (byte)uVar6;
            }
            else {
              auVar63._4_4_ = fVar77;
              auVar63._0_4_ = fVar77;
              auVar63._8_4_ = fVar77;
              auVar63._12_4_ = fVar77;
              auVar63._16_4_ = fVar77;
              auVar63._20_4_ = fVar77;
              auVar63._24_4_ = fVar77;
              auVar63._28_4_ = fVar77;
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar21),auVar63,
                                        *(undefined1 (*) [32])(uVar12 + 0x40 + uVar21));
              auVar40 = vsubps_avx512vl(ZEXT1632(auVar25),auVar29);
              auVar41 = vmulps_avx512vl(auVar32,auVar40);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar18),auVar63,
                                        *(undefined1 (*) [32])(uVar12 + 0x40 + uVar18));
              auVar40 = vsubps_avx512vl(ZEXT1632(auVar25),auVar30);
              auVar40 = vmulps_avx512vl(auVar33,auVar40);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar19),auVar63,
                                        *(undefined1 (*) [32])(uVar12 + 0x40 + uVar19));
              auVar42 = vsubps_avx512vl(ZEXT1632(auVar25),auVar31);
              auVar42 = vmulps_avx512vl(auVar34,auVar42);
              auVar40 = vmaxps_avx(auVar40,auVar42);
              auVar41 = vmaxps_avx512vl(auVar38,auVar41);
              auVar40 = vmaxps_avx(auVar41,auVar40);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar21 ^ 0x20)),
                                        auVar63,*(undefined1 (*) [32])
                                                 (uVar12 + 0x40 + (uVar21 ^ 0x20)));
              auVar41 = vsubps_avx512vl(ZEXT1632(auVar25),auVar29);
              auVar42 = vmulps_avx512vl(auVar35,auVar41);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar18 ^ 0x20)),
                                        auVar63,*(undefined1 (*) [32])
                                                 (uVar12 + 0x40 + (uVar18 ^ 0x20)));
              auVar41 = vsubps_avx512vl(ZEXT1632(auVar25),auVar30);
              auVar41 = vmulps_avx512vl(auVar36,auVar41);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar19 ^ 0x20)),
                                        auVar63,*(undefined1 (*) [32])
                                                 (uVar12 + 0x40 + (uVar19 ^ 0x20)));
              auVar43 = vsubps_avx512vl(ZEXT1632(auVar25),auVar31);
              auVar43 = vmulps_avx512vl(auVar37,auVar43);
              auVar41 = vminps_avx(auVar41,auVar43);
              auVar42 = vminps_avx512vl(auVar39,auVar42);
              auVar41 = vminps_avx(auVar42,auVar41);
              if (uVar15 == 6) {
                uVar6 = vcmpps_avx512vl(auVar40,auVar41,2);
                uVar7 = vcmpps_avx512vl(auVar63,*(undefined1 (*) [32])(uVar12 + 0x1c0),0xd);
                uVar8 = vcmpps_avx512vl(auVar63,*(undefined1 (*) [32])(uVar12 + 0x1e0),1);
                bVar20 = (byte)uVar6 & (byte)uVar7 & (byte)uVar8;
              }
              else {
                uVar6 = vcmpps_avx512vl(auVar40,auVar41,2);
                bVar20 = (byte)uVar6;
              }
            }
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar20);
          }
          if ((uVar14 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar22 = 4;
            }
            else {
              uVar12 = uVar14 & 0xfffffffffffffff0;
              lVar16 = 0;
              for (uVar14 = unaff_R15; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
              {
                lVar16 = lVar16 + 1;
              }
              iVar22 = 0;
              for (uVar13 = unaff_R15 - 1 & unaff_R15; uVar14 = *(ulong *)(uVar12 + lVar16 * 8),
                  uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
                pNVar17->ptr = uVar14;
                pNVar17 = pNVar17 + 1;
                lVar16 = 0;
                for (uVar14 = uVar13; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
              }
            }
          }
          else {
            iVar22 = 6;
          }
        } while (iVar22 == 0);
        if (iVar22 == 6) {
          auVar75 = ZEXT1664(auVar75._0_16_);
          in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
          cVar11 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar14 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          iVar22 = 0;
          if (cVar11 != '\0') {
            ray->tfar = -INFINITY;
            iVar22 = 3;
          }
        }
      } while (iVar22 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }